

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

uint64_t mse_8xh_16bit_sse2(uint8_t *dst,int dstride,uint16_t *src,int sstride,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  uint in_ECX;
  ulong in_RDX;
  ulong uVar4;
  longlong in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar5 [16];
  __m128i v;
  __m128i sum_64x1;
  int i;
  __m128i square_result;
  __m128i zeros;
  __m128i sub_result_16x8;
  __m128i res1_64x2;
  __m128i res0_64x2;
  __m128i res0_32x4;
  __m128i src_16x8;
  __m128i dst_16x8;
  __m128i dst_8x8;
  uint64_t sum;
  int local_21c;
  long local_218;
  long lStack_210;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  uint64_t local_180 [3];
  int local_164;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68;
  undefined8 uStack_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  long local_38;
  long lStack_30;
  ulong local_28;
  ulong uStack_20;
  ulong local_18;
  ulong uStack_10;
  
  local_164 = (int)in_RSI;
  local_180[0] = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_218 = 0;
  lStack_210 = 0;
  uVar4 = in_RDX;
  for (local_21c = 0; local_21c < in_R8D; local_21c = local_21c + 1) {
    local_d0 = (undefined8 *)(in_RDI + local_21c * local_164);
    local_e8 = *local_d0;
    uStack_e0 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_b8._0_1_ = (byte)local_e8;
    local_b8._1_1_ = (byte)((ulong)local_e8 >> 8);
    local_b8._2_1_ = (byte)((ulong)local_e8 >> 0x10);
    local_b8._3_1_ = (byte)((ulong)local_e8 >> 0x18);
    local_b8._4_1_ = (byte)((ulong)local_e8 >> 0x20);
    local_b8._5_1_ = (byte)((ulong)local_e8 >> 0x28);
    local_b8._6_1_ = (byte)((ulong)local_e8 >> 0x30);
    local_b8._7_1_ = (byte)((ulong)local_e8 >> 0x38);
    uVar4 = (ulong)in_ECX;
    local_f0 = (undefined8 *)(in_RDX + (long)(int)(local_21c * in_ECX) * 2);
    uVar1 = *local_f0;
    uVar2 = local_f0[1];
    local_108._0_2_ = (short)uVar1;
    local_108._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_108._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_108._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_100._0_2_ = (short)uVar2;
    uStack_100._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_100._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_100._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_118._2_2_ = (ushort)local_b8._1_1_;
    local_118._4_2_ = (ushort)local_b8._2_1_;
    local_118._6_2_ = (ushort)local_b8._3_1_;
    uStack_110._2_2_ = (ushort)local_b8._5_1_;
    uStack_110._4_2_ = (ushort)local_b8._6_1_;
    uStack_110._6_2_ = (ushort)local_b8._7_1_;
    local_138 = CONCAT26(local_108._6_2_ - local_118._6_2_,
                         CONCAT24(local_108._4_2_ - local_118._4_2_,
                                  CONCAT22(local_108._2_2_ - local_118._2_2_,
                                           (short)local_108 - (ushort)(byte)local_b8)));
    uStack_130 = CONCAT26(uStack_100._6_2_ - uStack_110._6_2_,
                          CONCAT24(uStack_100._4_2_ - uStack_110._4_2_,
                                   CONCAT22(uStack_100._2_2_ - uStack_110._2_2_,
                                            (short)uStack_100 - (ushort)local_b8._4_1_)));
    auVar3._8_8_ = uStack_130;
    auVar3._0_8_ = local_138;
    auVar5._8_8_ = uStack_130;
    auVar5._0_8_ = local_138;
    auVar5 = pmaddwd(auVar3,auVar5);
    local_1c8 = auVar5._0_8_;
    uStack_1c0 = auVar5._8_8_;
    uStack_90 = uStack_1c0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98._0_4_ = auVar5._0_4_;
    local_98._4_4_ = auVar5._4_4_;
    local_78 = local_1c8;
    local_88 = 0;
    uStack_80 = 0;
    uStack_70._0_4_ = auVar5._8_4_;
    uStack_70._4_4_ = auVar5._12_4_;
    local_38 = local_218;
    lStack_30 = lStack_210;
    local_18 = (ulong)(uint)local_98;
    uStack_10 = (ulong)local_98._4_4_;
    local_28 = (ulong)(uint)uStack_70;
    uStack_20 = (ulong)uStack_70._4_4_;
    local_48 = local_18 + local_28;
    lStack_40 = uStack_10 + uStack_20;
    local_218 = local_218 + local_48;
    lStack_210 = lStack_210 + lStack_40;
    local_128 = local_138;
    uStack_120 = uStack_130;
    local_118 = (ulong)CONCAT16(local_b8._3_1_,
                                (uint6)CONCAT14(local_b8._2_1_,
                                                (uint)CONCAT12(local_b8._1_1_,(ushort)(byte)local_b8
                                                              )));
    uStack_110 = (ulong)CONCAT16(local_b8._7_1_,
                                 (uint6)CONCAT14(local_b8._6_1_,
                                                 (uint)CONCAT12(local_b8._5_1_,
                                                                (ushort)local_b8._4_1_)));
    local_108 = uVar1;
    uStack_100 = uVar2;
    local_b8 = local_e8;
    local_98 = local_1c8;
    uStack_70 = uStack_1c0;
  }
  local_58 = local_218;
  lStack_50 = lStack_210;
  local_68 = lStack_210;
  uStack_60 = 0;
  v[1] = uVar4;
  v[0] = in_RSI;
  xx_storel_64(local_180,v);
  return local_180[0];
}

Assistant:

static uint64_t mse_8xh_16bit_sse2(uint8_t *dst, int dstride, uint16_t *src,
                                   int sstride, int h) {
  uint64_t sum = 0;
  __m128i dst_8x8, dst_16x8;
  __m128i src_16x8;
  __m128i res0_32x4, res0_64x2, res1_64x2;
  __m128i sub_result_16x8;
  const __m128i zeros = _mm_setzero_si128();
  __m128i square_result = _mm_setzero_si128();

  for (int i = 0; i < h; i++) {
    dst_8x8 = _mm_loadl_epi64((__m128i const *)(&dst[(i + 0) * dstride]));
    dst_16x8 = _mm_unpacklo_epi8(dst_8x8, zeros);

    src_16x8 = _mm_loadu_si128((__m128i *)&src[i * sstride]);

    sub_result_16x8 = _mm_sub_epi16(src_16x8, dst_16x8);

    res0_32x4 = _mm_madd_epi16(sub_result_16x8, sub_result_16x8);

    res0_64x2 = _mm_unpacklo_epi32(res0_32x4, zeros);
    res1_64x2 = _mm_unpackhi_epi32(res0_32x4, zeros);

    square_result =
        _mm_add_epi64(square_result, _mm_add_epi64(res0_64x2, res1_64x2));
  }
  const __m128i sum_64x1 =
      _mm_add_epi64(square_result, _mm_srli_si128(square_result, 8));
  xx_storel_64(&sum, sum_64x1);
  return sum;
}